

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

IndirOpnd * __thiscall
IR::Instr::HoistMemRefAddress(Instr *this,MemRefOpnd *memRefOpnd,OpCode loadOpCode)

{
  Func *this_00;
  code *pcVar1;
  bool bVar2;
  AddrOpndKind addrOpndKind;
  IRType IVar3;
  undefined4 *puVar4;
  void *originalAddress;
  AddrOpnd *pAVar5;
  Func *this_01;
  RegOpnd *baseOpnd;
  Instr *instr;
  Opnd *this_02;
  IndirOpnd *pIVar6;
  Instr *newInstr;
  RegOpnd *addressRegOpnd;
  IndirOpnd *indirOpnd;
  AddrOpnd *addrOpnd;
  Func *func;
  AddrOpndKind kind;
  intptr_t address;
  OpCode loadOpCode_local;
  MemRefOpnd *memRefOpnd_local;
  Instr *this_local;
  
  if (memRefOpnd == (MemRefOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xa3b,"(memRefOpnd)","memRefOpnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = LowererMDArch::IsLegalMemLoc(memRefOpnd);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xa3d,"(!LowererMDArch::IsLegalMemLoc(memRefOpnd))",
                       "!LowererMDArch::IsLegalMemLoc(memRefOpnd)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  originalAddress = (void *)MemRefOpnd::GetMemLoc(memRefOpnd);
  addrOpndKind = MemRefOpnd::GetAddrKind(memRefOpnd);
  this_00 = this->m_func;
  pAVar5 = AddrOpnd::New((intptr_t)originalAddress,addrOpndKind,this->m_func,true,(Var)0x0);
  this_01 = Func::GetTopFunc(this_00);
  IVar3 = Opnd::GetType(&memRefOpnd->super_Opnd);
  addressRegOpnd =
       (RegOpnd *)
       Func::GetConstantAddressIndirOpnd
                 (this_01,(intptr_t)originalAddress,&pAVar5->super_Opnd,addrOpndKind,IVar3,
                  loadOpCode);
  if ((IndirOpnd *)addressRegOpnd == (IndirOpnd *)0x0) {
    baseOpnd = RegOpnd::New(TyUint64,this_00);
    pAVar5 = AddrOpnd::New((intptr_t)originalAddress,addrOpndKind,this_00,true,(Var)0x0);
    instr = New(loadOpCode,&baseOpnd->super_Opnd,&pAVar5->super_Opnd,this_00);
    InsertBefore(this,instr);
    IVar3 = Opnd::GetType(&memRefOpnd->super_Opnd);
    addressRegOpnd = (RegOpnd *)IndirOpnd::New(baseOpnd,0,IVar3,this_00,true);
    IndirOpnd::SetAddrKind((IndirOpnd *)addressRegOpnd,addrOpndKind,originalAddress);
  }
  this_02 = DeepReplace(this,&memRefOpnd->super_Opnd,&addressRegOpnd->super_Opnd);
  pIVar6 = Opnd::AsIndirOpnd(this_02);
  return pIVar6;
}

Assistant:

IndirOpnd *
Instr::HoistMemRefAddress(MemRefOpnd *const memRefOpnd, const Js::OpCode loadOpCode)
{
    Assert(memRefOpnd);
#if defined(_M_IX86) || defined(_M_X64)
    Assert(!LowererMDArch::IsLegalMemLoc(memRefOpnd));
#endif
    intptr_t address = memRefOpnd->GetMemLoc();
    IR::AddrOpndKind kind = memRefOpnd->GetAddrKind();
    Func *const func = m_func;
    IR::AddrOpnd * addrOpnd = IR::AddrOpnd::New(address, kind, this->m_func, true);
    IR::IndirOpnd * indirOpnd = func->GetTopFunc()->GetConstantAddressIndirOpnd(address, addrOpnd, kind, memRefOpnd->GetType(), loadOpCode);

    if (indirOpnd == nullptr)
    {
        IR::RegOpnd * addressRegOpnd = IR::RegOpnd::New(TyMachPtr, func);
        IR::Instr *const newInstr =
            IR::Instr::New(
            loadOpCode,
            addressRegOpnd,
            IR::AddrOpnd::New(address, kind, func, true),
            func);
        InsertBefore(newInstr);

        indirOpnd = IR::IndirOpnd::New(addressRegOpnd, 0, memRefOpnd->GetType(), func, true);
#if DBG_DUMP
        // TODO: michhol oop jit, make intptr
        indirOpnd->SetAddrKind(kind, (void*)address);
#endif
    }
    return DeepReplace(memRefOpnd, indirOpnd)->AsIndirOpnd();
}